

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_Constructor_Test::TestBody
          (ConfidentialTransactionContext_Constructor_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  uint in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  char *in_stack_fffffffffffffb10;
  AssertionResult gtest_ar_5;
  string exp_tx_str;
  ConfidentialTransaction ctx;
  ConfidentialTransactionContext str_tx;
  ConfidentialTransactionContext copy_tx2;
  ConfidentialTransactionContext copy_tx;
  ConfidentialTransactionContext copy_tx3;
  ConfidentialTransactionContext empty_tx;
  ConfidentialTransactionContext byte_tx;
  
  std::__cxx11::string::string
            ((string *)&exp_tx_str,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,(allocator *)&empty_tx);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&empty_tx);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&str_tx,(string *)&exp_tx_str)
  ;
  std::__cxx11::string::string
            ((string *)&copy_tx,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,(allocator *)&copy_tx3);
  cfd::core::ByteData::ByteData((ByteData *)&copy_tx2,(string *)&copy_tx);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&byte_tx,(ByteData *)&copy_tx2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&copy_tx2);
  std::__cxx11::string::~string((string *)&copy_tx);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&copy_tx,&str_tx);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&ctx,(string *)&exp_tx_str);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&copy_tx2,&ctx);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&copy_tx3);
  cfd::ConfidentialTransactionContext::operator=(&copy_tx3,&str_tx);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar1 = (char *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"str_tx.GetHex().c_str()","byte_tx.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb08);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffb08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x48,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffb08,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb08);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar1 = (char *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"str_tx.GetHex().c_str()","copy_tx.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb08);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffb08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffb08,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb08);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar1 = (char *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"str_tx.GetHex().c_str()","copy_tx2.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb08);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffb08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffb08,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb08);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar1 = (char *)CONCAT71(gtest_ar_5._1_7_,gtest_ar_5.success_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"str_tx.GetHex().c_str()","copy_tx3.GetHex().c_str()",pcVar1,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb08);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffb08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4b,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffb08,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb08);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTRNE
            (in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             (char *)gtest_ar.message_.ptr_,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb08);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffb08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4c,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffb08,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb08);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::ConfidentialTransactionContext::GetLockTimeDisabledSequence();
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0xffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_5,"ConfidentialTransactionContext::GetLockTimeDisabledSequence()"
             ,"0xffffffffU",(uint *)&stack0xfffffffffffffb08,(uint *)&gtest_ar);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffb08);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x4e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar,(Message *)&stack0xfffffffffffffb08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xfffffffffffffb08);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&copy_tx3);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&copy_tx2);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&ctx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&copy_tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&byte_tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&str_tx);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&empty_tx);
  std::__cxx11::string::~string((string *)&exp_tx_str);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, Constructor)
{
  std::string exp_tx_str = "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000";
  ConfidentialTransactionContext empty_tx;
  ConfidentialTransactionContext str_tx(exp_tx_str);
  ConfidentialTransactionContext byte_tx(
      ByteData("02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"));
  ConfidentialTransactionContext copy_tx(str_tx);
  ConfidentialTransaction ctx(exp_tx_str);
  ConfidentialTransactionContext copy_tx2(ctx);
  ConfidentialTransactionContext copy_tx3;
  copy_tx3 = str_tx;

  EXPECT_STREQ(str_tx.GetHex().c_str(), byte_tx.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx2.GetHex().c_str());
  EXPECT_STREQ(str_tx.GetHex().c_str(), copy_tx3.GetHex().c_str());
  EXPECT_STRNE(str_tx.GetHex().c_str(), empty_tx.GetHex().c_str());

  EXPECT_EQ(ConfidentialTransactionContext::GetLockTimeDisabledSequence(), 0xffffffffU);
}